

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_unsigned_char>::
     Load(istream *in,vector<unsigned_char,_std::allocator<unsigned_char>_> *object)

{
  uchar local_29;
  ulong uStack_28;
  uchar obj;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  uint32_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *object_local;
  istream *in_local;
  
  pvStack_18 = object;
  object_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in;
  std::istream::read((char *)in,(long)&i + 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(pvStack_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(pvStack_18,(ulong)i._4_4_);
  for (uStack_28 = 0; uStack_28 < i._4_4_; uStack_28 = uStack_28 + 1) {
    Load<unsigned_char>((istream *)object_local,&local_29);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_18,&local_29);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }